

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O1

void __thiscall cmNinjaTargetGenerator::~cmNinjaTargetGenerator(cmNinjaTargetGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer ppcVar3;
  
  this->_vptr_cmNinjaTargetGenerator = (_func_int **)&PTR__cmNinjaTargetGenerator_005fc678;
  if (this->MacOSXContentGenerator != (MacOSXContentGeneratorType *)0x0) {
    (*(this->MacOSXContentGenerator->super_MacOSXContentGeneratorType).
      _vptr_MacOSXContentGeneratorType[1])();
  }
  pcVar2 = (this->ModuleDefinitionFile)._M_dataplus._M_p;
  paVar1 = &(this->ModuleDefinitionFile).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->LanguageFlags)._M_t);
  ppcVar3 = (this->CustomCommands).
            super__Vector_base<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppcVar3 != (pointer)0x0) {
    operator_delete(ppcVar3,(long)(this->CustomCommands).
                                  super__Vector_base<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppcVar3
                   );
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->Objects);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->MacContentFolders)._M_t);
  return;
}

Assistant:

cmNinjaTargetGenerator::~cmNinjaTargetGenerator()
{
  delete this->MacOSXContentGenerator;
}